

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::Assemble(Mat *this,Mat *a,Mat *b)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int i;
  long lVar8;
  
  iVar1 = a->n_rows_;
  iVar2 = a->n_cols_;
  pdVar3 = a->v_;
  pdVar4 = this->v_;
  for (lVar8 = 0; lVar8 < (long)iVar2 * (long)iVar1; lVar8 = lVar8 + 1) {
    pdVar4[lVar8] = pdVar3[lVar8];
  }
  uVar5 = b->n_cols_ * b->n_rows_;
  pdVar3 = b->v_;
  pdVar4 = this->v_;
  uVar7 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pdVar4[uVar7] = pdVar3[uVar7];
  }
  return;
}

Assistant:

void Mat::Assemble(const Mat & a, const Mat &b)
{	
	for (int i=0 ; i<a.Size() ; i++)
		v_[i] = a(i);
	for (int j=0 ; j<b.Size(); j++)
		v_[j] = b(j);
}